

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O0

void __thiscall DataRefs::GetWeather(DataRefs *this,float *hPa,string *stationId,string *METAR)

{
  string *in_RCX;
  string *in_RDX;
  undefined4 *in_RSI;
  lock_guard<std::recursive_mutex> *in_RDI;
  lock_guard<std::recursive_mutex> lock;
  mutex_type *in_stack_ffffffffffffffb8;
  
  std::lock_guard<std::recursive_mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffb8);
  *in_RSI = *(undefined4 *)&in_RDI[0x12e]._M_device;
  std::__cxx11::string::operator=(in_RDX,(string *)(in_RDI + 0x138));
  std::__cxx11::string::operator=(in_RCX,(string *)(in_RDI + 0x13c));
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x13fdbe);
  return;
}

Assistant:

void DataRefs::GetWeather (float& hPa, std::string& stationId, std::string& METAR)
{
    // protected against reads from the main thread
    std::lock_guard<std::recursive_mutex> lock(mutexDrUpdate);
    
    hPa = lastWeatherHPA;
    stationId = lastWeatherStationId;
    METAR = lastWeatherMETAR;
}